

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureDependenciesFBOIncompleteness4Test::iterate
          (MultisampleTextureDependenciesFBOIncompleteness4Test *this)

{
  uint uVar1;
  int iVar2;
  deUint32 dVar3;
  ContextInfo *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  MessageBuilder local_4e8;
  MessageBuilder local_368;
  MessageBuilder local_1e8;
  uint local_64;
  undefined1 local_5d;
  GLenum fbo_completeness;
  allocator<char> local_49;
  string local_48;
  int local_24;
  long lStack_20;
  GLint gl_max_samples_value;
  Functions *gl;
  MultisampleTextureDependenciesFBOIncompleteness4Test *pMStack_10;
  bool are_2d_ms_array_tos_supported;
  MultisampleTextureDependenciesFBOIncompleteness4Test *this_local;
  
  pMStack_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  gl._7_1_ = glu::ContextInfo::isExtensionSupported
                       (this_00,"GL_OES_texture_storage_multisample_2d_array");
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  local_24 = 0;
  (**(code **)(lStack_20 + 0x868))(0x8d57,&local_24);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() generated an error for GL_MAX_SAMPLES pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x2fc);
  if (local_24 < 3) {
    local_5d = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"GL_MAX_SAMPLES pname value < 3, skipping",&local_49);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_48);
    local_5d = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if ((gl._7_1_ & 1) != 0) {
    (**(code **)(lStack_20 + 0x6f8))(1,&this->to_id_2d_multisample_array_color);
  }
  (**(code **)(lStack_20 + 0x6f8))(1,&this->to_id_2d_multisample_color);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"At least one glGenTextures() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x30b);
  (**(code **)(lStack_20 + 0x6d0))(1,&this->fbo_id);
  (**(code **)(lStack_20 + 0x78))(0x8ca9,this->fbo_id);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"Could not set up a framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x311);
  (**(code **)(lStack_20 + 0x6e8))(1,&this->rbo_id);
  (**(code **)(lStack_20 + 0xa0))(0x8d41,this->rbo_id);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"Could not set up a renderbuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x317);
  (**(code **)(lStack_20 + 0xb8))(0x9100,this->to_id_2d_multisample_color);
  (**(code **)(lStack_20 + 0x1390))(0x9100,2,0x8058,2,2,0);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"Could not set up GL_RGBA8 multisample texture storage.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,800);
  if ((gl._7_1_ & 1) != 0) {
    (**(code **)(lStack_20 + 0xb8))(0x9102,this->to_id_2d_multisample_array_color);
    (**(code **)(lStack_20 + 0x13a8))(0x9102,2,0x8058,2,2,2,1);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"Could not set up second GL_RGBA8 multisample texture storage.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x32c);
  }
  (**(code **)(lStack_20 + 0x1240))(0x8d41,3,0x8058,2);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"Could not set up renderbuffer storage.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x334);
  (**(code **)(lStack_20 + 0x6a0))(0x8ca9,0x8ce0,0x9100,this->to_id_2d_multisample_color,0);
  local_64 = (**(code **)(lStack_20 + 0x170))(0x8ca9);
  if (local_64 != 0x8cd5) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1e8,(char (*) [42])"Invalid FBO completeness status reported:");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_64);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [35])0x2ac8e2a);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid FBO completeness status reported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x342);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  uVar1 = 0x8cd5;
  if ((gl._7_1_ & 1) != 0) {
    (**(code **)(lStack_20 + 0x6b8))(0x8ca9,0x8ce1,this->to_id_2d_multisample_array_color,0);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"Could not set up FBO color attachments",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x34c);
    local_64 = (**(code **)(lStack_20 + 0x170))(0x8ca9);
    if (local_64 != 0x8d56) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_368,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_368,(char (*) [42])"Invalid FBO completeness status reported:");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_64);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [49])" expected: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_368);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid FBO completeness status reported.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                 ,0x357);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    uVar1 = 0x8d56;
  }
  local_64 = uVar1;
  (**(code **)(lStack_20 + 0x688))(0x8ca9,0x8ce2,0x8d41,this->rbo_id);
  local_64 = (**(code **)(lStack_20 + 0x170))(0x8ca9);
  if (local_64 != 0x8d56) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4e8,(char (*) [42])"Invalid FBO completeness status reported:");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_64);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [49])" expected: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4e8);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid FBO completeness status reported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x366);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureDependenciesFBOIncompleteness4Test::iterate()
{
	bool are_2d_ms_array_tos_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Only execute if GL_MAX_SAMPLES pname value >= 3 */
	glw::GLint gl_max_samples_value = 0;

	gl.getIntegerv(GL_MAX_SAMPLES, &gl_max_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() generated an error for GL_MAX_SAMPLES pname");

	if (gl_max_samples_value < 3)
	{
		throw tcu::NotSupportedError("GL_MAX_SAMPLES pname value < 3, skipping");
	}

	/* Set up texture objects */
	if (are_2d_ms_array_tos_supported)
	{
		gl.genTextures(1, &to_id_2d_multisample_array_color);
	}

	gl.genTextures(1, &to_id_2d_multisample_color);

	GLU_EXPECT_NO_ERROR(gl.getError(), "At least one glGenTextures() call failed");

	/* Set up a framebuffer object */
	gl.genFramebuffers(1, &fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a framebuffer object");

	/* Set up a renderbuffer object */
	gl.genRenderbuffers(1, &rbo_id);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a renderbuffer object");

	/* Set up first GL_RGBA8 multisample texture storage */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id_2d_multisample_color);
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, /* samples */
							   GL_RGBA8, 2,					 /* width */
							   2,							 /* height */
							   GL_FALSE);					 /* fixedsamplelocations */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up GL_RGBA8 multisample texture storage.");

	if (are_2d_ms_array_tos_supported)
	{
		/* Set up second GL_RGBA8 multisample texture storage */
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_multisample_array_color);
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, /* samples */
								   GL_RGBA8, 2,							   /* width */
								   2,									   /* height */
								   2,									   /* depth */
								   GL_TRUE);							   /* fixedsamplelocations */

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up second GL_RGBA8 multisample texture storage.");
	}

	/* Set up renderbuffer storage */
	gl.renderbufferStorageMultisample(GL_RENDERBUFFER, 3, /* samples */
									  GL_RGBA8, 2,		  /* width */
									  2);				  /* height */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up renderbuffer storage.");

	/* Set up FBO's zeroth color attachment */
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE,
							to_id_2d_multisample_color, 0); /* level */

	/* Make sure FBO is considered complete at this point */
	glw::GLenum fbo_completeness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fbo_completeness != GL_FRAMEBUFFER_COMPLETE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid FBO completeness status reported:" << fbo_completeness
						   << " expected: GL_FRAMEBUFFER_COMPLETE" << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid FBO completeness status reported.");
	}

	if (are_2d_ms_array_tos_supported)
	{
		/* Set up FBO's first color attachment */
		gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, to_id_2d_multisample_array_color,
								   0,  /* level */
								   0); /* layer */

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up FBO color attachments");

		/* FBO should now be considered incomplete */
		fbo_completeness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

		if (fbo_completeness != GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid FBO completeness status reported:" << fbo_completeness
							   << " expected: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE" << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FBO completeness status reported.");
		}
	}

	/* Set up FBO's second color attachment */
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT2, GL_RENDERBUFFER, rbo_id);

	/* FBO should now be considered incomplete */
	fbo_completeness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fbo_completeness != GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid FBO completeness status reported:" << fbo_completeness
						   << " expected: GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE" << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid FBO completeness status reported.");
	}

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}